

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_CfdGetAssetCommitment_Test::TestBody
          (cfdcapi_elements_transaction_CfdGetAssetCommitment_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  char **in_stack_00000020;
  char *in_stack_00000028;
  char *in_stack_00000030;
  void *in_stack_00000038;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  char *str_buffer;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *commitment;
  char *abf;
  char *asset;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffde8;
  AssertionResult *in_stack_fffffffffffffdf0;
  CfdErrorCode *in_stack_fffffffffffffdf8;
  AssertionResult *pAVar4;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  void **in_stack_fffffffffffffe08;
  void *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe88;
  AssertHelper local_170;
  Message local_168;
  undefined4 local_15c;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140;
  AssertionResult local_138;
  AssertHelper local_128;
  Message local_120;
  undefined4 local_114;
  AssertionResult local_110;
  char *local_100;
  AssertHelper local_f8;
  Message local_f0;
  AssertionResult local_e8;
  AssertHelper local_d8;
  Message local_d0;
  undefined4 local_c4;
  AssertionResult local_c0;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffffe08);
  local_2c = 0;
  pAVar4 = &local_28;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffe08,
             (char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
             in_stack_fffffffffffffdf8,(int *)in_stack_fffffffffffffdf0);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!(bool)uVar1) {
    testing::Message::Message(local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x368bda);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x766,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x368c3d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x368c92);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(type *)0x368cc6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar2) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x767,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x368dc2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x368e3d);
  if (local_14 == 0) {
    local_a0 = "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3";
    local_a8 = "346dbdba35c19f6e3958a2c00881024503f6611d23d98d270b98ef9de3edc7a3";
    local_b0 = (char *)0x0;
    local_14 = CfdGetAssetCommitment
                         (in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020);
    local_c4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffe08,
               (char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
               in_stack_fffffffffffffdf8,(int *)in_stack_fffffffffffffdf0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
    if (!bVar2) {
      testing::Message::Message(&local_d0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x368f42);
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x770,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_d8);
      testing::Message::~Message((Message *)0x368f9f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x368ff4);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_e8,
                 "\"0a533b742a568c0b5285bf5bdfe9623a78082d19fac9be1678f7c3adbb48b34d29\"",
                 "commitment","0a533b742a568c0b5285bf5bdfe9623a78082d19fac9be1678f7c3adbb48b34d29",
                 local_b0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
      if (!bVar2) {
        testing::Message::Message(&local_f0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x369097);
        testing::internal::AssertHelper::AssertHelper
                  (&local_f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x774,pcVar3);
        testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
        testing::internal::AssertHelper::~AssertHelper(&local_f8);
        testing::Message::~Message((Message *)0x3690f4);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x369149);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffdf8);
    }
  }
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffe28);
  if (local_14 != 0) {
    local_100 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage
                         ((void *)CONCAT17(uVar1,in_stack_fffffffffffffe88),(char **)pAVar4);
    local_114 = 0;
    pAVar4 = &local_110;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffe08,
               (char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
               in_stack_fffffffffffffdf8,(int *)in_stack_fffffffffffffdf0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!bVar2) {
      testing::Message::Message(&local_120);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x369245);
      testing::internal::AssertHelper::AssertHelper
                (&local_128,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x77d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_128,&local_120);
      testing::internal::AssertHelper::~AssertHelper(&local_128);
      testing::Message::~Message((Message *)0x3692a2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3692f7);
    testing::internal::CmpHelperSTREQ((internal *)&local_138,"\"\"","str_buffer","",local_100);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_138);
    if (!bVar2) {
      testing::Message::Message(&local_140);
      in_stack_fffffffffffffe08 =
           (void **)testing::AssertionResult::failure_message((AssertionResult *)0x36938c);
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x77e,(char *)in_stack_fffffffffffffe08);
      testing::internal::AssertHelper::operator=(&local_148,&local_140);
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      testing::Message::~Message((Message *)0x3693e9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36943e);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffdf8);
    local_100 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffdf8);
  local_15c = 0;
  pAVar4 = &local_158;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffe08,
             (char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
             (CfdErrorCode *)pAVar4,(int *)in_stack_fffffffffffffdf0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar2) {
    testing::Message::Message(&local_168);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x36950e);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x784,pcVar3);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    testing::Message::~Message((Message *)0x36956b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3695c0);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, CfdGetAssetCommitment) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  if (ret == kCfdSuccess) {
    const char* asset =
        "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3";
    const char* abf = "346dbdba35c19f6e3958a2c00881024503f6611d23d98d270b98ef9de3edc7a3";

    char* commitment = nullptr;
    ret = CfdGetAssetCommitment(handle, asset, abf, &commitment);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
          "0a533b742a568c0b5285bf5bdfe9623a78082d19fac9be1678f7c3adbb48b34d29",
          commitment);
      CfdFreeStringBuffer(commitment);
    }
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}